

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

UnicodeSet * anon_unknown.dwarf_38436b::makeSet(UProperty property,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 UVar3;
  UnicodeSet *pUVar4;
  UnicodeSet *this;
  UnicodeSet *local_70;
  UChar32 local_64;
  UChar32 c;
  UChar32 rangeEnd;
  int32_t i;
  UChar32 startHasProperty;
  int32_t numRanges;
  UnicodeSet *inclusions;
  LocalPointerBase<icu_63::UnicodeSet> local_28;
  LocalPointer<icu_63::UnicodeSet> set;
  UErrorCode *errorCode_local;
  UnicodeSet *pUStack_10;
  UProperty property_local;
  
  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr =
       (LocalPointerBase<icu_63::UnicodeSet>)(LocalPointerBase<icu_63::UnicodeSet>)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pUVar4 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
    local_70 = (UnicodeSet *)0x0;
    if (pUVar4 != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::UnicodeSet(pUVar4);
      local_70 = pUVar4;
    }
    icu_63::LocalPointer<icu_63::UnicodeSet>::LocalPointer
              ((LocalPointer<icu_63::UnicodeSet> *)&local_28,local_70);
    UVar1 = icu_63::LocalPointerBase<icu_63::UnicodeSet>::isNull(&local_28);
    if (UVar1 == '\0') {
      pUVar4 = icu_63::CharacterProperties::getInclusionsForProperty
                         (property,(UErrorCode *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr)
      ;
      UVar1 = ::U_FAILURE(*(UErrorCode *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
      if (UVar1 == '\0') {
        iVar2 = icu_63::UnicodeSet::getRangeCount(pUVar4);
        rangeEnd = -1;
        for (c = 0; c < iVar2; c = c + 1) {
          UVar3 = icu_63::UnicodeSet::getRangeEnd(pUVar4,c);
          for (local_64 = icu_63::UnicodeSet::getRangeStart(pUVar4,c); local_64 <= UVar3;
              local_64 = local_64 + 1) {
            UVar1 = u_hasBinaryProperty_63(local_64,property);
            if (UVar1 == '\0') {
              if (-1 < rangeEnd) {
                this = icu_63::LocalPointerBase<icu_63::UnicodeSet>::operator->(&local_28);
                icu_63::UnicodeSet::add(this,rangeEnd,local_64 + -1);
                rangeEnd = -1;
              }
            }
            else if (rangeEnd < 0) {
              rangeEnd = local_64;
            }
          }
        }
        if (-1 < rangeEnd) {
          pUVar4 = icu_63::LocalPointerBase<icu_63::UnicodeSet>::operator->(&local_28);
          icu_63::UnicodeSet::add(pUVar4,rangeEnd,0x10ffff);
        }
        pUVar4 = icu_63::LocalPointerBase<icu_63::UnicodeSet>::operator->(&local_28);
        icu_63::UnicodeSet::freeze(pUVar4);
        pUStack_10 = icu_63::LocalPointerBase<icu_63::UnicodeSet>::orphan(&local_28);
      }
      else {
        pUStack_10 = (UnicodeSet *)0x0;
      }
    }
    else {
      *(undefined4 *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr = 7;
      pUStack_10 = (UnicodeSet *)0x0;
    }
    icu_63::LocalPointer<icu_63::UnicodeSet>::~LocalPointer
              ((LocalPointer<icu_63::UnicodeSet> *)&local_28);
  }
  else {
    pUStack_10 = (UnicodeSet *)0x0;
  }
  return pUStack_10;
}

Assistant:

UnicodeSet *makeSet(UProperty property, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return nullptr; }
    icu::LocalPointer<UnicodeSet> set(new UnicodeSet());
    if (set.isNull()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    const UnicodeSet *inclusions =
        icu::CharacterProperties::getInclusionsForProperty(property, errorCode);
    if (U_FAILURE(errorCode)) { return nullptr; }
    int32_t numRanges = inclusions->getRangeCount();
    UChar32 startHasProperty = -1;

    for (int32_t i = 0; i < numRanges; ++i) {
        UChar32 rangeEnd = inclusions->getRangeEnd(i);
        for (UChar32 c = inclusions->getRangeStart(i); c <= rangeEnd; ++c) {
            // TODO: Get a UCharacterProperty.BinaryProperty to avoid the property dispatch.
            if (u_hasBinaryProperty(c, property)) {
                if (startHasProperty < 0) {
                    // Transition from false to true.
                    startHasProperty = c;
                }
            } else if (startHasProperty >= 0) {
                // Transition from true to false.
                set->add(startHasProperty, c - 1);
                startHasProperty = -1;
            }
        }
    }
    if (startHasProperty >= 0) {
        set->add(startHasProperty, 0x10FFFF);
    }
    set->freeze();
    return set.orphan();
}